

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cc
# Opt level: O0

StringReader * __thiscall
phosg::StringReader::sub
          (StringReader *__return_storage_ptr__,StringReader *this,size_t offset,size_t size)

{
  size_t size_local;
  size_t offset_local;
  StringReader *this_local;
  
  if (offset < this->length) {
    if (this->length < offset + size) {
      StringReader(__return_storage_ptr__,this->data + offset,this->length - offset,0);
    }
    else {
      StringReader(__return_storage_ptr__,this->data + offset,size,0);
    }
  }
  else {
    StringReader(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

StringReader StringReader::sub(size_t offset, size_t size) const {
  if (offset >= this->length) {
    return StringReader();
  }
  if (offset + size > this->length) {
    return StringReader(
        reinterpret_cast<const char*>(this->data) + offset,
        this->length - offset);
  }
  return StringReader(reinterpret_cast<const char*>(this->data) + offset, size);
}